

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  int p1;
  int op;
  ExprList_item *pEVar1;
  
  if (pParse->pVdbe != (Vdbe *)0x0) {
    p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
    if (p1 != target) {
      while ((pExpr != (Expr *)0x0 && ((pExpr->flags & 0x82000) != 0))) {
        if ((pExpr->flags >> 0x13 & 1) == 0) {
          if (pExpr->op != 'q') break;
          pEVar1 = (ExprList_item *)&pExpr->pLeft;
        }
        else {
          pEVar1 = ((pExpr->x).pList)->a;
        }
        pExpr = pEVar1->pExpr;
      }
      if ((pExpr == (Expr *)0x0) ||
         ((op = 0x50, (pExpr->flags & 0x400000) == 0 && (pExpr->op != 0xb0)))) {
        op = 0x51;
      }
      sqlite3VdbeAddOp3(pParse->pVdbe,op,p1,target,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( pExpr==0 || !ExprHasVVAProperty(pExpr,EP_Immutable) );
  assert( target>0 && target<=pParse->nMem );
  assert( pParse->pVdbe!=0 || pParse->db->mallocFailed );
  if( pParse->pVdbe==0 ) return;
  inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
  if( inReg!=target ){
    u8 op;
    Expr *pX = sqlite3ExprSkipCollateAndLikely(pExpr);
    testcase( pX!=pExpr );
    if( ALWAYS(pX)
     && (ExprHasProperty(pX,EP_Subquery) || pX->op==TK_REGISTER)
    ){
      op = OP_Copy;
    }else{
      op = OP_SCopy;
    }
    sqlite3VdbeAddOp2(pParse->pVdbe, op, inReg, target);
  }
}